

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void __thiscall
spatial_region::f_init_cos
          (spatial_region *this,double a0y,double a0z,double xsigma,double ysigma,double zsigma,
          double x0,int sscos,bool b_sign,double x1,double phase,double y0,double z0,bool append,
          double phi,double xtarget,double ytarget,double ztarget)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  celle *pcVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  int iVar28;
  cellb *pcVar29;
  ulong uVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  double dVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 in_register_00001308 [56];
  undefined1 auVar123 [16];
  undefined1 in_register_00001348 [56];
  undefined1 auVar125 [16];
  undefined1 in_register_00001388 [56];
  undefined1 auVar126 [16];
  double dVar128;
  undefined1 in_ZMM9 [64];
  ulong uVar129;
  undefined1 auVar130 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar140 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar141 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar142 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar143 [64];
  double local_288;
  double local_280;
  ulong local_278;
  double local_270;
  undefined1 local_258 [16];
  double local_248;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  ulong local_1c8;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_b8;
  undefined1 auVar41 [16];
  undefined1 auVar124 [64];
  undefined1 auVar127 [64];
  
  auVar47 = in_ZMM29._0_16_;
  auVar46 = in_ZMM26._0_16_;
  auVar45 = in_ZMM27._0_16_;
  auVar44 = in_ZMM28._0_16_;
  auVar134._8_56_ = in_register_00001388;
  auVar134._0_8_ = x1;
  auVar109._8_56_ = in_register_00001348;
  auVar109._0_8_ = x0;
  auVar88._8_56_ = in_register_00001308;
  auVar88._0_8_ = zsigma;
  auVar130._8_56_ = in_register_000012c8;
  auVar130._0_8_ = ysigma;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = z0;
  auVar124 = ZEXT1664(auVar123);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = y0;
  auVar127 = ZEXT1664(auVar126);
  if (sscos == 0) {
    dVar128 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
    auVar38 = vunpcklpd_avx(auVar88._0_16_,auVar130._0_16_);
    auVar68._0_8_ = auVar38._0_8_ + auVar38._0_8_;
    auVar68._8_8_ = auVar38._8_8_ + auVar38._8_8_;
    auVar38._8_8_ = 0x40040d931ff62705;
    auVar38._0_8_ = 0x40040d931ff62705;
    auVar38 = vmulpd_avx512vl(auVar68,auVar38);
    auVar40._8_8_ = 0x4008000000000000;
    auVar40._0_8_ = 0x4008000000000000;
    auVar39 = vdivpd_avx512vl(auVar38,auVar40);
    goto LAB_0010ed3d;
  }
  if (sscos == 3) {
    dVar128 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
  }
  else {
    if (sscos == 2) {
      dVar128 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
      auVar39._8_8_ = ysigma * 100.0;
      auVar39._0_8_ = ysigma * 100.0;
      goto LAB_0010ed3d;
    }
    if (sscos != 1) {
      auVar39 = ZEXT816(0);
      dVar128 = 0.0;
      goto LAB_0010ed3d;
    }
    dVar128 = xsigma * 0.822;
  }
  auVar38 = vunpcklpd_avx(auVar88._0_16_,auVar130._0_16_);
  auVar42._8_8_ = 0x3fea4dd2f1a9fbe7;
  auVar42._0_8_ = 0x3fea4dd2f1a9fbe7;
  auVar39 = vmulpd_avx512vl(auVar38,auVar42);
LAB_0010ed3d:
  auVar48 = vcvtsi2sd_avx512f(in_ZMM9._0_16_,this->ny);
  auVar126 = vunpcklpd_avx(auVar126,auVar123);
  auVar130 = ZEXT864(0) << 0x40;
  uVar27 = 0;
  dVar4 = this->dz;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = y0 * y0;
  auVar38 = vfmadd231sd_fma(auVar43,auVar134._0_16_,auVar134._0_16_);
  auVar123 = vfmadd231sd_fma(auVar38,auVar123,auVar123);
  auVar90._0_8_ = auVar126._0_8_ ^ 0x8000000000000000;
  auVar90._8_8_ = auVar126._8_8_ ^ 0x8000000000000000;
  auVar123 = vsqrtsd_avx(auVar123,auVar123);
  auVar69._0_8_ = auVar123._0_8_;
  auVar125._0_8_ = -x1 / auVar69._0_8_;
  auVar125._8_8_ = in_register_00001388._0_8_ ^ 0x8000000000000000;
  auVar69._8_8_ = auVar69._0_8_;
  auVar126 = vmovhpd_avx(ZEXT816(0),0x3ff0000000000000);
  auVar123 = vdivpd_avx(auVar90,auVar69);
  dVar54 = auVar123._0_8_;
  auVar91._0_8_ = -dVar54;
  auVar91._8_8_ = auVar123._8_8_ ^ 0x8000000000000000;
  auVar38 = vshufpd_avx(auVar123,auVar123,1);
  auVar68 = vunpcklpd_avx(auVar91,auVar125);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar54 * dVar54;
  auVar40 = vfmadd231sd_fma(auVar50,auVar125,auVar125);
  auVar40 = vsqrtsd_avx(auVar40,auVar40);
  auVar49 = vcvtsi2sd_avx512f(in_ZMM13._0_16_,this->nz);
  auVar70._0_8_ = auVar40._0_8_;
  auVar70._8_8_ = auVar70._0_8_;
  if (auVar70._0_8_ != 0.0) {
    uVar27 = 0xff;
  }
  if (NAN(auVar70._0_8_)) {
    uVar27 = 0xff;
  }
  auVar40 = vdivpd_avx512vl(auVar68,auVar70);
  bVar36 = (bool)((byte)uVar27 & 1);
  auVar41._0_8_ = (double)((ulong)bVar36 * auVar40._0_8_ | (ulong)!bVar36 * auVar126._0_8_);
  bVar36 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar41._8_8_ = (double)((ulong)bVar36 * auVar40._8_8_ | (ulong)!bVar36 * auVar126._8_8_);
  auVar71._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
  auVar71._8_8_ = 0x8000000000000000;
  auVar42 = vshufpd_avx512vl(auVar41,auVar125,1);
  auVar126 = vshufpd_avx(auVar41,auVar41,1);
  auVar40 = vunpcklpd_avx(ZEXT816(0),auVar41);
  auVar43 = vmulpd_avx512vl(auVar42,auVar71);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = auVar41._0_8_ * dVar54;
  auVar68 = vfmsub213sd_fma(auVar126,auVar125,auVar92);
  auVar126 = vfmadd213pd_fma(auVar40,auVar123,auVar43);
  if ((phi != 0.0) || (dVar54 = this->dy, NAN(phi))) {
    vmovsd_avx512f(auVar48);
    auVar136._8_8_ = 0;
    auVar136._0_8_ = this->dy;
    vmovsd_avx512f(auVar136);
    vmovsd_avx512f(auVar49);
    local_248 = cos(phi);
    dVar54 = sin(phi);
    auVar26._8_8_ = extraout_XMM0_Qb;
    auVar26._0_8_ = local_248;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_b8;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_1c8;
    auVar127 = ZEXT864((ulong)y0);
    auVar124 = ZEXT864((ulong)z0);
    auVar116._8_8_ = local_248;
    auVar116._0_8_ = local_248;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = auVar68._0_8_ * dVar54;
    auVar40 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar26,auVar93);
    auVar130 = ZEXT1664(auVar40);
    auVar110._0_8_ = auVar126._0_8_ * dVar54;
    auVar110._8_8_ = auVar126._8_8_ * dVar54;
    auVar94._0_8_ = auVar41._0_8_ * dVar54;
    auVar94._8_8_ = auVar41._8_8_ * dVar54;
    auVar126 = vfmsub231pd_fma(auVar94,auVar126,auVar116);
    auVar41 = vfmadd231pd_fma(auVar110,auVar41,auVar116);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar54 * -0.0;
    auVar68 = vfmadd231sd_fma(auVar72,auVar68,auVar26);
    dVar54 = local_288;
    local_258 = auVar42;
  }
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar54;
  iVar32 = this->nx;
  if (0 < iVar32) {
    auVar111._8_8_ = 0x8000000000000000;
    auVar111._0_8_ = 0x8000000000000000;
    iVar28 = this->ny;
    auVar40 = vshufpd_avx512vl(auVar41,auVar41,1);
    auVar44 = vxorpd_avx512vl(auVar44,auVar44);
    auVar142 = ZEXT1664(auVar44);
    auVar45 = vxorpd_avx512vl(auVar45,auVar45);
    auVar141 = ZEXT1664(auVar45);
    auVar46 = vxorpd_avx512vl(auVar46,auVar46);
    auVar140 = ZEXT1664(auVar46);
    auVar46 = vxorpd_avx512vl(auVar47,auVar47);
    auVar143 = ZEXT1664(auVar46);
    lVar35 = 0;
    uVar129 = auVar130._0_8_;
    auVar46 = vmulsd_avx512f(auVar48,ZEXT816(0xbfe0000000000000));
    auVar45 = vmulsd_avx512f(auVar49,ZEXT816(0xbfe0000000000000));
    auVar44 = vxorpd_avx512vl(auVar109._0_16_,auVar111);
    auVar47 = vshufpd_avx512vl(auVar126,auVar126,1);
    auVar46 = vmulsd_avx512f(auVar135,auVar46);
    auVar134 = ZEXT1664(auVar46);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = dVar4;
    auVar45 = vmulsd_avx512f(auVar120,auVar45);
    auVar137 = ZEXT1664(auVar45);
    vmovsd_avx512f(auVar46);
    vmovsd_avx512f(auVar45);
    auVar46 = vshufpd_avx(auVar39,auVar39,1);
    dVar115 = auVar46._0_8_;
    dVar89 = auVar39._0_8_;
    dVar4 = dVar115 * dVar115 * dVar115 * dVar115;
    dVar55 = 3.141592653589793 / dVar128;
    dVar56 = -dVar55;
    dVar54 = dVar128 * dVar128 * dVar128 * dVar128;
    dVar22 = dVar89 * dVar89 * dVar89 * dVar89;
    auVar109 = ZEXT864(0) << 0x40;
    auVar46 = vshufpd_avx512vl(auVar42,auVar123,1);
    auVar88 = ZEXT864(0) << 0x40;
    do {
      if (0 < iVar28) {
        uVar33 = (ulong)(uint)this->nz;
        auVar45 = vcvtsi2sd_avx512f(auVar38,(int)lVar35);
        auVar138 = ZEXT1664(auVar45);
        lVar34 = 0;
        vmovsd_avx512f(auVar45);
        do {
          if (0 < (int)uVar33) {
            auVar45 = vcvtsi2sd_avx512f(auVar123,(int)lVar34);
            auVar139 = ZEXT1664(auVar45);
            lVar31 = 0;
            bVar36 = false;
            uVar30 = 0;
            bVar37 = true;
            vmovsd_avx512f(auVar45);
            do {
              auVar43 = auVar143._0_16_;
              auVar39 = auVar88._0_16_;
              auVar95 = auVar109._0_16_;
              local_208 = auVar142._0_16_;
              auVar117._8_8_ = 0;
              auVar117._0_8_ = this->dy;
              auVar112._8_8_ = 0;
              auVar112._0_8_ = this->dx;
              auVar121._0_8_ = (double)(int)uVar30;
              auVar121._8_8_ = auVar123._8_8_;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = this->dz;
              auVar45 = vfmadd132sd_avx512f(auVar121,auVar137._0_16_,auVar45);
              auVar42 = vfmadd213sd_avx512f(auVar117,auVar139._0_16_,auVar134._0_16_);
              auVar48 = vfmadd213sd_avx512f(auVar112,auVar138._0_16_,auVar44);
              auVar133._8_8_ = 0;
              auVar133._0_8_ = xtarget;
              auVar48 = vsubsd_avx512f(auVar48,auVar133);
              auVar122._8_8_ = 0;
              auVar122._0_8_ = auVar45._0_8_ - auVar124._0_8_;
              auVar131._8_8_ = 0;
              auVar131._0_8_ = ztarget;
              auVar49 = vsubsd_avx512f(auVar122,auVar131);
              auVar118._8_8_ = 0;
              auVar118._0_8_ = auVar42._0_8_ - auVar127._0_8_;
              auVar132._8_8_ = 0;
              auVar132._0_8_ = ytarget;
              auVar42 = vsubsd_avx512f(auVar118,auVar132);
              auVar45 = vmulsd_avx512f(auVar123,auVar42);
              auVar45 = vfmadd231sd_avx512f(auVar45,auVar125,auVar48);
              auVar45 = vfmadd231sd_avx512f(auVar45,auVar38,auVar49);
              auVar45 = vucomisd_avx512f(auVar45);
              if (bVar36 || bVar37) {
LAB_0010f6bf:
                if (!append) {
                  pcVar21 = (this->ce).p._M_t.
                            super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                            super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar35][lVar34];
                  *(undefined8 *)((long)&pcVar21->ez + lVar31) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar21->ex + lVar31);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  pcVar29 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar35][lVar34];
                  *(undefined8 *)((long)&pcVar29->bz + lVar31) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar29->bx + lVar31);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                }
              }
              else {
                auVar5._8_8_ = 0;
                auVar5._0_8_ = -dVar128;
                auVar69 = vucomisd_avx512f(auVar5);
                if (bVar36 || bVar37) goto LAB_0010f6bf;
                auVar50 = vmulsd_avx512f(auVar40,auVar42);
                auVar50 = vfmadd231sd_avx512f(auVar50,auVar41,auVar48);
                auVar50 = vfmadd231sd_avx512f(auVar50,auVar130._0_16_,auVar49);
                vucomisd_avx512f(auVar50);
                if ((bVar36 || bVar37) ||
                   (auVar6._8_8_ = 0, auVar6._0_8_ = -dVar115, auVar50 = vucomisd_avx512f(auVar6),
                   bVar36 || bVar37)) goto LAB_0010f6bf;
                auVar42 = vmulsd_avx512f(auVar47,auVar42);
                auVar42 = vfmadd213sd_fma(auVar48,auVar126,auVar42);
                auVar42 = vfmadd213sd_avx512f(auVar49,auVar68,auVar42);
                vucomisd_avx512f(auVar42);
                if ((bVar36 || bVar37) ||
                   (auVar7._8_8_ = 0, auVar7._0_8_ = -dVar89, auVar42 = vucomisd_avx512f(auVar7),
                   bVar36 || bVar37)) goto LAB_0010f6bf;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = phase;
                auVar48 = vaddsd_avx512f(auVar69,auVar8);
                dVar67 = auVar48._0_8_;
                dVar57 = auVar45._0_8_;
                if (sscos == 0) {
                  auVar45 = vmulsd_avx512f(auVar69,ZEXT816(0x400921fb54442d18));
                  vmovsd_avx512f(auVar42);
                  vmovsd_avx512f(auVar50);
                  dVar57 = (auVar45._0_8_ * 0.5) / dVar57;
                  dVar58 = cos(dVar57);
                  dVar59 = (local_288 * 3.141592653589793 * 0.5) / dVar115;
                  local_288 = cos(dVar59);
                  dVar60 = ((double)local_258._0_8_ * 3.141592653589793 * 0.5) / dVar89;
                  local_258._0_8_ = cos(dVar60);
                  dVar61 = sin(dVar57);
                  dVar59 = sin(dVar59);
                  dVar60 = sin(dVar60);
                  dVar57 = (double)local_258._0_8_ * local_288 * local_288 * (double)local_258._0_8_
                  ;
                  dVar62 = cos(dVar67);
                  dVar63 = sin(dVar67);
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = dVar58;
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = dVar62 * dVar58;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = dVar58 * dVar63 * dVar56 * dVar61;
                  auVar45 = vfmadd231sd_fma(auVar78,auVar100,auVar13);
                  local_248 = auVar45._0_8_ * dVar57 * a0y;
                  dVar62 = sin(dVar67);
                  dVar63 = cos(dVar67);
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ = dVar58;
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = dVar62 * dVar58;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = dVar58 * dVar63 * dVar55 * dVar61;
                  auVar45 = vfmadd231sd_fma(auVar79,auVar101,auVar14);
                  auVar25._8_8_ = 0x8000000000000000;
                  auVar25._0_8_ = 0x8000000000000000;
                  local_218._8_8_ = 0;
                  local_218._0_8_ = auVar45._0_8_ * dVar57 * a0z;
                  local_208 = vxorpd_avx512vl(local_218,auVar25);
                  dVar57 = sin(dVar67);
                  dVar61 = cos(dVar67);
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ =
                       (((double)local_258._0_8_ *
                         (double)local_258._0_8_ * dVar58 * dVar58 * dVar57 * a0y *
                        3.141592653589793) / dVar115) * local_288;
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = dVar59;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ =
                       ((local_288 * local_288 * dVar58 * dVar58 * dVar61 * a0z * -3.141592653589793
                        ) / dVar89) * (double)local_258._0_8_ * dVar60;
                  auVar45 = vfmadd231sd_fma(auVar80,auVar102,auVar15);
                  local_278 = auVar45._0_8_;
                  dVar57 = cos(dVar67);
                  dVar67 = sin(dVar67);
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ =
                       (double)local_258._0_8_ *
                       (double)local_258._0_8_ *
                       ((dVar58 * dVar58 * dVar57 * a0z * 3.141592653589793) / dVar115) * local_288;
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = local_288 * local_288 * dVar58 * dVar58 * dVar67 * a0y;
                  auVar45 = vmulsd_avx512f(auVar81,ZEXT816(0x400921fb54442d18));
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = dVar59;
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = (auVar45._0_8_ / dVar89) * (double)local_258._0_8_ * dVar60;
                  auVar39 = vfmadd231sd_fma(auVar82,auVar103,auVar16);
LAB_0010fa8e:
                  auVar143 = ZEXT864(local_278);
                  auVar141 = ZEXT1664(local_218);
                  auVar140 = ZEXT864((ulong)local_248);
                  auVar130 = ZEXT864(uVar129);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = local_248;
                }
                else {
                  if (sscos == 3) {
                    auVar45 = vmulsd_avx512f(auVar69,ZEXT816(0x400921fb54442d18));
                    vmovsd_avx512f(auVar42);
                    vmovsd_avx512f(auVar50);
                    dVar57 = (auVar45._0_8_ * 0.5) / dVar57;
                    local_280 = cos(dVar57);
                    local_270 = sin(dVar57);
                    auVar106._8_8_ = 0;
                    auVar106._0_8_ = local_288;
                    auVar85._8_8_ = 0;
                    auVar85._0_8_ = (double)local_258._0_8_ * (double)local_258._0_8_;
                    auVar45 = vfmadd213sd_fma(auVar106,auVar106,auVar85);
                    auVar45 = vsqrtsd_avx(auVar45,auVar45);
                    dVar57 = 0.0;
                    dVar58 = auVar45._0_8_;
                    if (dVar58 <= dVar115) {
                      dVar57 = cos((dVar58 * dVar58 * dVar58 * dVar58 * 3.141592653589793 * 0.5) /
                                   dVar4);
                    }
                    dVar58 = cos(dVar67);
                    dVar59 = sin(dVar67);
                    auVar107._8_8_ = 0;
                    auVar107._0_8_ = local_280;
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = dVar58 * local_280;
                    auVar86._8_8_ = 0;
                    auVar86._0_8_ = local_280 * dVar59 * dVar56 * local_270;
                    auVar45 = vfmadd231sd_fma(auVar86,auVar107,auVar18);
                    local_248 = auVar45._0_8_ * dVar57 * dVar57 * a0y;
                    local_288 = dVar57 * dVar57 * a0z;
                  }
                  else {
                    if (sscos != 2) {
                      if (sscos == 1) {
                        auVar45 = vmulsd_avx512f(auVar69,ZEXT816(0x400921fb54442d18));
                        vmovsd_avx512f(auVar42);
                        vmovsd_avx512f(auVar50);
                        vmovsd_avx512f(auVar69);
                        auVar45 = vmulsd_avx512f(auVar69,auVar45);
                        auVar45 = vmulsd_avx512f(auVar69,auVar45);
                        auVar45 = vmulsd_avx512f(auVar69,auVar45);
                        dVar57 = (auVar45._0_8_ * 0.5) / dVar54;
                        dVar58 = cos(dVar57);
                        dVar59 = (local_288 * local_288 * local_288 * local_288 * 3.141592653589793
                                 * 0.5) / dVar4;
                        dVar60 = cos(dVar59);
                        dVar61 = ((double)local_258._0_8_ *
                                  (double)local_258._0_8_ *
                                  (double)local_258._0_8_ *
                                  (double)local_258._0_8_ * 3.141592653589793 * 0.5) / dVar22;
                        dVar62 = cos(dVar61);
                        dVar63 = sin(dVar57);
                        dVar59 = sin(dVar59);
                        dVar61 = sin(dVar61);
                        dVar57 = dVar62 * dVar60 * dVar60 * dVar62;
                        dVar64 = cos(dVar67);
                        dVar65 = (local_248 * local_248 * local_248 * 12.566370614359172) / dVar54;
                        dVar66 = sin(dVar67);
                        auVar96._8_8_ = 0;
                        auVar96._0_8_ = dVar58;
                        auVar9._8_8_ = 0;
                        auVar9._0_8_ = dVar64 * dVar58;
                        auVar73._8_8_ = 0;
                        auVar73._0_8_ = dVar58 * dVar66 * dVar65 * dVar63;
                        auVar45 = vfmsub231sd_fma(auVar73,auVar96,auVar9);
                        local_248 = auVar45._0_8_ * dVar57 * a0y;
                        dVar64 = sin(dVar67);
                        dVar66 = cos(dVar67);
                        auVar97._8_8_ = 0;
                        auVar97._0_8_ = dVar58;
                        auVar10._8_8_ = 0;
                        auVar10._0_8_ = dVar64 * dVar58;
                        auVar74._8_8_ = 0;
                        auVar74._0_8_ = dVar58 * dVar66 * dVar65 * dVar63;
                        auVar45 = vfmadd231sd_fma(auVar74,auVar97,auVar10);
                        auVar23._8_8_ = 0x8000000000000000;
                        auVar23._0_8_ = 0x8000000000000000;
                        local_218._8_8_ = 0;
                        local_218._0_8_ = auVar45._0_8_ * dVar57 * a0z;
                        local_208 = vxorpd_avx512vl(local_218,auVar23);
                        dVar57 = sin(dVar67);
                        dVar63 = cos(dVar67);
                        auVar98._8_8_ = 0;
                        auVar98._0_8_ =
                             dVar62 * dVar62 * dVar58 * dVar58 * ((local_288 *
                                                                  local_288 *
                                                                  local_288 *
                                                                  dVar57 * a0y * 4.0 *
                                                                  3.141592653589793) / dVar4) *
                             dVar60;
                        auVar11._8_8_ = 0;
                        auVar11._0_8_ = dVar59;
                        auVar75._8_8_ = 0;
                        auVar75._0_8_ =
                             dVar60 * dVar60 * dVar58 * dVar58 * (((double)local_258._0_8_ *
                                                                  (double)local_258._0_8_ *
                                                                  (double)local_258._0_8_ *
                                                                  dVar63 * a0z * 4.0 *
                                                                  -3.141592653589793) / dVar22) *
                             dVar62 * dVar61;
                        auVar45 = vfmadd231sd_fma(auVar75,auVar98,auVar11);
                        local_278 = auVar45._0_8_;
                        dVar57 = cos(dVar67);
                        local_288 = dVar62 * dVar62 * dVar58 * dVar58 * ((local_288 *
                                                                         local_288 *
                                                                         local_288 *
                                                                         dVar57 * a0z * 4.0 *
                                                                         3.141592653589793) / dVar4)
                                    * dVar60;
                        dVar57 = sin(dVar67);
                        auVar76._8_8_ = 0;
                        auVar76._0_8_ = dVar57 * a0y * 4.0;
                        auVar45 = vmulsd_avx512f(auVar76,ZEXT816(0x400921fb54442d18));
                        auVar99._8_8_ = 0;
                        auVar99._0_8_ = local_288;
                        auVar12._8_8_ = 0;
                        auVar12._0_8_ = dVar59;
                        auVar77._8_8_ = 0;
                        auVar77._0_8_ =
                             dVar60 * dVar60 * dVar58 * dVar58 * (((double)local_258._0_8_ *
                                                                  (double)local_258._0_8_ *
                                                                  (double)local_258._0_8_ *
                                                                  auVar45._0_8_) / dVar22) * dVar62
                             * dVar61;
                        auVar39 = vfmadd231sd_fma(auVar77,auVar99,auVar12);
                        goto LAB_0010fa8e;
                      }
                      goto LAB_0010fd7e;
                    }
                    vmovsd_avx512f(auVar42);
                    vmovsd_avx512f(auVar50);
                    auVar45 = vmulsd_avx512f(auVar69,ZEXT816(0x400921fb54442d18));
                    dVar57 = (auVar45._0_8_ * 0.5) / dVar57;
                    local_280 = cos(dVar57);
                    local_270 = sin(dVar57);
                    auVar104._8_8_ = 0;
                    auVar104._0_8_ = local_288;
                    auVar83._8_8_ = 0;
                    auVar83._0_8_ = (double)local_258._0_8_ * (double)local_258._0_8_;
                    auVar45 = vfmadd213sd_fma(auVar104,auVar104,auVar83);
                    auVar45 = vsqrtsd_avx(auVar45,auVar45);
                    dVar58 = 1.0;
                    dVar57 = auVar45._0_8_;
                    if ((dVar57 != 0.0) || (NAN(dVar57))) {
                      dVar57 = (dVar57 * 3.141592653589793) / ysigma;
                      dVar58 = sin(dVar57);
                      dVar58 = dVar58 / dVar57;
                    }
                    dVar57 = cos(dVar67);
                    dVar59 = sin(dVar67);
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = local_280;
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = dVar57 * local_280;
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = local_280 * dVar59 * dVar56 * local_270;
                    auVar45 = vfmadd231sd_fma(auVar84,auVar105,auVar17);
                    local_248 = auVar45._0_8_ * dVar58 * a0y;
                    local_288 = dVar58 * a0z;
                  }
                  dVar57 = sin(dVar67);
                  local_258._0_8_ = dVar57 * local_280;
                  dVar67 = cos(dVar67);
                  auVar108._8_8_ = 0;
                  auVar108._0_8_ = local_280;
                  auVar140 = ZEXT864((ulong)local_248);
                  auVar130 = ZEXT864(uVar129);
                  auVar45 = vxorpd_avx512vl(auVar43,auVar43);
                  auVar143 = ZEXT1664(auVar45);
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = dVar57 * local_280;
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = local_280 * dVar67 * dVar55 * local_270;
                  auVar45 = vfmadd231sd_fma(auVar87,auVar108,auVar19);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = local_248;
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = local_288;
                  auVar45 = vmulsd_avx512f(auVar45,auVar20);
                  auVar141 = ZEXT1664(auVar45);
                  auVar24._8_8_ = 0x8000000000000000;
                  auVar24._0_8_ = 0x8000000000000000;
                  local_208 = vxorpd_avx512vl(auVar45,auVar24);
                  auVar39 = SUB6416(ZEXT864(0),0) << 0x40;
                }
LAB_0010fd7e:
                auVar45 = vxorpd_avx512vl(local_208,auVar111);
                auVar51._0_8_ =
                     (ulong)b_sign * auVar39._0_8_ +
                     (ulong)!b_sign * (auVar39._0_8_ ^ 0x8000000000000000);
                auVar51._8_8_ = auVar39._8_8_ ^ 0x8000000000000000;
                auVar88 = ZEXT1664(auVar51);
                auVar52._0_8_ =
                     (ulong)b_sign * auVar95._0_8_ +
                     (ulong)!b_sign * (auVar95._0_8_ ^ 0x8000000000000000);
                auVar52._8_8_ = auVar95._8_8_ ^ 0x8000000000000000;
                auVar109 = ZEXT1664(auVar52);
                auVar48 = auVar140._0_16_;
                auVar39 = vmulsd_avx512f(auVar41,auVar48);
                auVar53._0_8_ = (ulong)b_sign * local_208._0_8_ + (ulong)!b_sign * auVar45._0_8_;
                auVar53._8_8_ = auVar45._8_8_;
                auVar142 = ZEXT1664(auVar53);
                auVar45 = vmulsd_avx512f(auVar40,auVar48);
                auVar43 = auVar143._0_16_;
                auVar39 = vfmadd231sd_avx512f(auVar39,auVar43,auVar125);
                pcVar21 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar35][lVar34];
                auVar49 = auVar141._0_16_;
                auVar39 = vfmadd231sd_avx512f(auVar39,auVar49,auVar126);
                auVar42 = auVar130._0_16_;
                if (append) {
                  auVar45 = vfmadd231sd_avx512f(auVar45,auVar43,auVar123);
                  auVar45 = vfmadd231sd_avx512f(auVar45,auVar49,auVar47);
                  auVar45 = vunpcklpd_avx(auVar39,auVar45);
                  pdVar2 = (double *)((long)&pcVar21->ex + lVar31);
                  dVar57 = pdVar2[1];
                  auVar119._8_8_ = auVar51._0_8_;
                  auVar119._0_8_ = auVar51._0_8_;
                  pdVar3 = (double *)((long)&pcVar21->ex + lVar31);
                  *pdVar3 = auVar45._0_8_ + *pdVar2;
                  pdVar3[1] = auVar45._8_8_ + dVar57;
                  auVar45 = vmulsd_avx512f(auVar42,auVar48);
                  auVar45 = vfmadd231sd_avx512f(auVar45,auVar43,auVar38);
                  auVar45 = vfmadd231sd_avx512f(auVar45,auVar49,auVar68);
                  *(double *)((long)&pcVar21->ez + lVar31) =
                       auVar45._0_8_ + *(double *)((long)&pcVar21->ez + lVar31);
                  auVar45 = vmovddup_avx512vl(auVar53);
                  auVar113._0_8_ = auVar41._0_8_ * auVar45._0_8_;
                  auVar113._8_8_ = auVar41._8_8_ * auVar45._8_8_;
                  auVar45 = vfmadd132pd_fma(auVar119,auVar113,auVar46);
                  auVar114._8_8_ = auVar52._0_8_;
                  auVar114._0_8_ = auVar52._0_8_;
                  pcVar29 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar35][lVar34];
                  auVar45 = vfmadd213pd_fma(auVar114,auVar126,auVar45);
                  pdVar2 = (double *)((long)&pcVar29->bx + lVar31);
                  dVar57 = pdVar2[1];
                  pdVar3 = (double *)((long)&pcVar29->bx + lVar31);
                  *pdVar3 = auVar45._0_8_ + *pdVar2;
                  pdVar3[1] = auVar45._8_8_ + dVar57;
                  auVar45 = vmulsd_avx512f(auVar42,auVar53);
                  auVar45 = vfmadd213sd_fma(auVar51,auVar38,auVar45);
                  auVar45 = vfmadd213sd_fma(auVar52,auVar68,auVar45);
                  dVar57 = auVar45._0_8_ + *(double *)((long)&pcVar29->bz + lVar31);
                }
                else {
                  *(long *)((long)&pcVar21->ex + lVar31) = auVar39._0_8_;
                  auVar39 = vmulsd_avx512f(auVar42,auVar48);
                  auVar45 = vfmadd231sd_avx512f(auVar45,auVar43,auVar123);
                  auVar39 = vfmadd231sd_avx512f(auVar39,auVar43,auVar38);
                  auVar45 = vfmadd231sd_avx512f(auVar45,auVar49,auVar47);
                  auVar39 = vfmadd231sd_avx512f(auVar39,auVar49,auVar68);
                  *(long *)((long)&pcVar21->ey + lVar31) = auVar45._0_8_;
                  *(long *)((long)&pcVar21->ez + lVar31) = auVar39._0_8_;
                  auVar45 = vmulsd_avx512f(auVar41,auVar53);
                  auVar45 = vfmadd231sd_fma(auVar45,auVar51,auVar125);
                  auVar45 = vfmadd231sd_fma(auVar45,auVar52,auVar126);
                  pcVar29 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar35][lVar34];
                  *(long *)((long)&pcVar29->bx + lVar31) = auVar45._0_8_;
                  auVar45 = vmulsd_avx512f(auVar40,auVar53);
                  auVar45 = vfmadd231sd_fma(auVar45,auVar51,auVar123);
                  auVar45 = vfmadd231sd_avx512f(auVar45,auVar52,auVar47);
                  *(long *)((long)&pcVar29->by + lVar31) = auVar45._0_8_;
                  auVar45 = vmulsd_avx512f(auVar42,auVar53);
                  auVar45 = vfmadd231sd_fma(auVar45,auVar38,auVar51);
                  auVar45 = vfmadd231sd_fma(auVar45,auVar68,auVar52);
                  dVar57 = auVar45._0_8_;
                }
                auVar124 = ZEXT864((ulong)z0);
                auVar127 = ZEXT864((ulong)y0);
                auVar134 = ZEXT864(local_120);
                auVar137 = ZEXT864(local_128);
                auVar138 = ZEXT864(local_118);
                auVar139 = ZEXT864(local_110);
                *(double *)((long)&pcVar29->bz + lVar31) = dVar57;
              }
              uVar33 = (ulong)this->nz;
              uVar30 = uVar30 + 1;
              lVar31 = lVar31 + 0x18;
              bVar36 = uVar30 < uVar33;
              bVar37 = uVar30 == uVar33;
            } while ((long)uVar30 < (long)uVar33);
            iVar28 = this->ny;
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 < iVar28);
        iVar32 = this->nx;
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 < iVar32);
  }
  return;
}

Assistant:

void spatial_region::f_init_cos(double a0y, double a0z, double xsigma, double ysigma, double zsigma, double x0, int sscos, bool b_sign, double x1, double phase, double y0, double z0, bool append, double phi, double xtarget, double ytarget, double ztarget)
{
    /* Для f_init_gauss xsigma, ysigma и zsigma имели смысл
     * половины масштабов лазерного импульса на уровне 1/e^2 (по
     * интенсивности) */
    /* x0 - расстояние от левой границы области (spatial_region'а) до
     * центра лазерного импульса, x1 - координата по x центра импульса
     * относительно центра всей области моделирования («суммы»
     * spatial_region'ов) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs, ys и zs */
    /* Если sscos==1, то огибающая задаётся в форме "супер-супер
     * косинуса"; для того, чтобы вычисление a_0 по энергии импульса
     * (при задании в конфиг-файле W) было верным, ширина импульса
     * вычисляется так, чтобы интеграл от квадрата его огибающей
     * совпадал с соответствующим интегралом от гауссова импульса */
    /* Если sscos == 2 (pearl), то поперечная огибающая для поля имеет вид (sin
     * r / r)^2, продольная - как для cos. zsigma не используется, ysigma -
     * расстояние от оси до первого нуля интенсивности в поперечном
     * распределении, xsigma - половина размера лазерного импульса на уровне
     * 1/e^2 (по интенсивности). E_x не вычисляется, а полагается равным нулю. */
    // sscos = 3 - sscos transverse, cos longutudinal
    double x,y,z,xi;
    double xs{0}, ys{0}, zs{0};
    if (sscos==0) {
        xs = xsigma*2*sqrt(2*PI)/3;
        ys = ysigma*2*sqrt(2*PI)/3;
        zs = zsigma*2*sqrt(2*PI)/3;
    } else if (sscos == 1) {
        xs = 0.822*xsigma;
        ys = 0.822*ysigma;
        zs = 0.822*zsigma;
    } else if (sscos == 2) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 1e2 * ysigma; // just >> ysigma
        zs = 1e2 * ysigma; // just >> ysigma
    } else if (sscos == 3) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 0.822 * ysigma;
        zs = 0.822 * zsigma;
    }
    double cosx,cosy,cosz,sinx,siny,sinz,tr_envelope;
    double y12,z12;
    y12 = 0.5*ny*dy;
    z12 = 0.5*nz*dz;
    double r0x,r0y,r0z;
    r0x = sqrt(x1*x1+y0*y0+z0*z0);
    r0y = -y0/r0x;
    r0z = -z0/r0x;
    r0x = -x1/r0x;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double ex{0}, ey{0}, ez{0}, bx{0}, by{0}, bz{0};
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                xi = x + phase;
                y = y0x*(i*dx-x0-xtarget) + y0y*(j*dy-y12-y0-ytarget) + y0z*(k*dz-z12-z0-ztarget);
                z = z0x*(i*dx-x0-xtarget) + z0y*(j*dy-y12-y0-ytarget) + z0z*(k*dz-z12-z0-ztarget);
                // vector potential envelope = (cosx*cosy*cosz)^2;
                if (x<xs&&x>-xs&&y<ys&&y>-ys&&z<zs&&z>-zs)
                {
                    if (sscos==0) {
                        cosx = cos(PI*x/2/xs);
                        cosy = cos(PI*y/2/ys);
                        cosz = cos(PI*z/2/zs);
                        sinx = sin(PI*x/2/xs);
                        siny = sin(PI*y/2/ys);
                        sinz = sin(PI*z/2/zs);
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*cosx*cosx*cosz*cosz*PI/ys*cosy*siny - a0z*cos(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                        bx = a0z*cos(xi)*cosx*cosx*PI/ys*cosz*cosz*cosy*siny + a0y*sin(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                    } else if (sscos == 1) {
                        cosx = cos(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        cosy = cos(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        cosz = cos(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        sinx = sin(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        siny = sin(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        sinz = sin(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - 4*PI*x*x*x/(xs*xs*xs*xs)*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + 4*PI*x*x*x/(xs*xs*xs*xs)*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny - a0z*cos(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                        bx = a0z*cos(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny + a0y*sin(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                    } else if (sscos == 2) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r != 0) {
                            siny = sin(PI * r / ysigma) / (PI * r / ysigma);
                        } else {
                            siny = 1;
                        }
                        ey = a0y * siny * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * siny * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    else if (sscos == 3) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r <= ys)
                        {
                            cosy = cos(PI*r*r*r*r/2/(ys*ys*ys*ys));
                        }
                        else
                        {
                            cosy = 0.0;
                        }
                        ey = a0y * cosy * cosy * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * cosy * cosy * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}